

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_utilities.h
# Opt level: O3

bool Gudhi::persistence_matrix::
     _multiply_target_and_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,true,false,false,false,true>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,true,false,false,false,true>>>>
               (Field_element *val,
               Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_true>_>_>
               *source,Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_true>_>_>
                       *targetColumn)

{
  bool bVar1;
  invalid_argument *this;
  anon_class_1_0_00000001 local_49;
  anon_class_8_1_e4bd5e45 local_48;
  anon_class_16_2_6d7ca8c5 local_40;
  anon_class_16_2_6d7ca8c5 local_30;
  anon_class_16_2_6d7ca8c5 local_20;
  
  if (*val != 0) {
    local_48.targetColumn = targetColumn;
    local_40.targetColumn = targetColumn;
    local_40.val = val;
    local_30.targetColumn = targetColumn;
    local_30.val = val;
    local_20.targetColumn = targetColumn;
    local_20.val = val;
    bVar1 = _generic_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,true,false,false,false,true>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,true,false,false,false,true>>>,Gudhi::persistence_matrix::_multiply_target_and_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,true,false,false,false,true>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,true,false,false,false,true>>>>(Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with____persistence_matrix::Column_types)7,true,false,false,false,true>>::Matrix_column_tag,1u>_false>___1_>
                      (source,targetColumn,&local_20,&local_48,&local_30,&local_49,&local_40);
    return bVar1;
  }
  this = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this,"A chain column should not be multiplied by 0.");
  __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

bool _multiply_target_and_add_to_column(const typename Column::Field_element& val,
                                        const Entry_range& source,
                                        Column& targetColumn)
{
  if (val == 0u) {
    if constexpr (Column::Master::isNonBasic && !Column::Master::Option_list::is_of_boundary_type) {
      throw std::invalid_argument("A chain column should not be multiplied by 0.");
      // this would not only mess up the base, but also the pivots stored.
    } else {
      targetColumn.clear();
    }
  }

  return _generic_add_to_column(
      source,
      targetColumn,
      [&](typename Column::Entry* entryTarget) {
        targetColumn.operators_->multiply_inplace(entryTarget->get_element(), val);
        // targetColumn.RA_opt::update_entry(*itTarget) produces an internal compiler error
        // even though it works in _generic_add_to_column... Probably because of the lambda.
        if constexpr (Column::Master::Option_list::has_row_access) targetColumn.update_entry(*entryTarget);
      },
      [&](typename Entry_range::const_iterator& itSource, const typename Column::Column_support::iterator& itTarget) {
        targetColumn._insert_entry(itSource->get_element(), itSource->get_row_index(), itTarget);
      },
      [&](typename Column::Field_element& targetElement, typename Entry_range::const_iterator& itSource) {
        targetColumn.operators_->multiply_and_add_inplace_front(targetElement, val, itSource->get_element());
      },
      [&]([[maybe_unused]] typename Column::Entry* entryTarget) {},
      [&](typename Column::Column_support::iterator& itTarget) {
        while (itTarget != targetColumn.column_.end()) {
          typename Column::Entry* targetEntry = _get_entry<typename Column::Entry>(itTarget);
          targetColumn.operators_->multiply_inplace(targetEntry->get_element(), val);
          if constexpr (Column::Master::Option_list::has_row_access) targetColumn.update_entry(*targetEntry);
          itTarget++;
        }
      }
    );
}